

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.cc
# Opt level: O0

void __thiscall
Zip::Zip(Zip *this,
        unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
        *is)

{
  byte bVar1;
  pointer pbVar2;
  streamoff sVar3;
  runtime_error *prVar4;
  ostream *poVar5;
  pointer pbVar6;
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  *in_RDI;
  stringstream ss;
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffca8;
  fpos<__mbstate_t> *in_stack_fffffffffffffcb0;
  string *this_00;
  uint8_t *in_stack_fffffffffffffcc8;
  undefined8 in_stack_fffffffffffffcd0;
  uint32_t expected;
  string *this_01;
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  *is_00;
  string local_2b8 [32];
  string local_298 [35];
  undefined1 local_275;
  undefined4 local_274;
  string local_270 [32];
  undefined8 local_250;
  undefined8 local_248;
  undefined1 local_23d;
  undefined4 local_23c;
  string local_238 [32];
  undefined8 local_218;
  undefined8 local_210;
  undefined1 local_201;
  string local_200 [32];
  stringstream local_1e0 [16];
  ostream local_1d0 [16];
  int *in_stack_fffffffffffffe40;
  char (*in_stack_fffffffffffffe48) [2];
  char (*in_stack_fffffffffffffe50) [88];
  char (*in_stack_fffffffffffffe58) [35];
  string local_50 [48];
  fpos local_20 [32];
  
  expected = (uint32_t)((ulong)in_stack_fffffffffffffcd0 >> 0x20);
  is_00 = in_RDI;
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::unique_ptr((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  std::__cxx11::string::string((string *)(is_00 + 0xe));
  this_01 = (string *)(is_00 + 0x12);
  std::__cxx11::string::string(this_01);
  pbVar2 = std::
           unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ::operator->((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                         *)0x2e1bf6);
  std::fpos<__mbstate_t>::fpos(in_stack_fffffffffffffcb0,(streamoff)in_stack_fffffffffffffca8);
  sVar3 = std::fpos::operator_cast_to_long(local_20);
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::operator->((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                *)0x2e1c3d);
  std::istream::seekg((long)pbVar2,-(int)sVar3);
  pbVar2 = std::
           unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ::operator->((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                         *)0x2e1c60);
  std::istream::read((char *)pbVar2,(long)(in_RDI + 1));
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::operator->((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                *)0x2e1c84);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    util::str<char[35],char[88],char[2],int>
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe40);
    std::runtime_error::runtime_error(prVar4,local_50);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  anon_unknown.dwarf_21303b::checkSignature(expected,in_stack_fffffffffffffcc8);
  if (*(short *)((long)&in_RDI[2]._M_t.
                        super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                        ._M_head_impl + 2) != 1) {
    std::__cxx11::stringstream::stringstream(local_1e0);
    poVar5 = std::operator<<(local_1d0,"eocd_.numEntries: ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,*(ushort *)
                                ((long)&in_RDI[2]._M_t.
                                        super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                                        ._M_head_impl + 2));
    std::operator<<(poVar5," != 1");
    local_201 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar4,local_200);
    local_201 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pbVar2 = std::
           unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ::operator->((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                         *)0x2e1f06);
  std::fpos<__mbstate_t>::fpos(in_stack_fffffffffffffcb0,(streamoff)in_stack_fffffffffffffca8);
  std::istream::seekg(pbVar2,local_218,local_210);
  pbVar2 = std::
           unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ::operator->((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                         *)0x2e1f4d);
  std::istream::read((char *)pbVar2,
                     (long)((long)&in_RDI[3]._M_t.
                                   super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                                   ._M_head_impl + 6));
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::operator->((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                *)0x2e1f71);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    local_23d = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_23c = 0x47;
    util::str<char[35],char[88],char[2],int>
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe40);
    std::runtime_error::runtime_error(prVar4,local_238);
    local_23d = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  anon_unknown.dwarf_21303b::checkSignature(expected,in_stack_fffffffffffffcc8);
  pbVar2 = std::
           unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ::operator->((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                         *)0x2e2093);
  std::fpos<__mbstate_t>::fpos(in_stack_fffffffffffffcb0,(streamoff)in_stack_fffffffffffffca8);
  std::istream::seekg(pbVar2,local_250,local_248);
  pbVar6 = std::
           unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ::operator->((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                         *)0x2e20da);
  std::istream::read((char *)pbVar6,
                     (long)((long)&in_RDI[9]._M_t.
                                   super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                                   ._M_head_impl + 4));
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::operator->((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                *)0x2e20fe);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    local_275 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_274 = 0x4d;
    util::str<char[35],char[88],char[2],int>
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe40);
    std::runtime_error::runtime_error(prVar4,local_270);
    local_275 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  anon_unknown.dwarf_21303b::checkSignature(expected,(uint8_t *)pbVar2);
  (anonymous_namespace)::loadString_abi_cxx11_(is_00,(size_t)this_01);
  this_00 = local_298;
  std::__cxx11::string::operator=((string *)(in_RDI + 0xe),this_00);
  std::__cxx11::string::~string(this_00);
  (anonymous_namespace)::loadString_abi_cxx11_(is_00,(size_t)this_01);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x12),local_2b8);
  std::__cxx11::string::~string(local_2b8);
  return;
}

Assistant:

Zip::Zip(std::unique_ptr<std::istream> is)
  : is_(std::move(is)) {
  // Load EOCD record
  is_->seekg(-(std::streampos) sizeof(eocd_), is_->end);
  is_->read((char*) &eocd_, sizeof(eocd_));
  ASSERT(is_->good());
  checkSignature(0x06054b50, eocd_.signature);

  // Expect only a single central directory header
  if (eocd_.numEntries != 1) {
    std::stringstream ss;
    ss << "eocd_.numEntries: " << eocd_.numEntries << " != 1";
    throw std::runtime_error(ss.str());
  }

  // Load central directory file header
  is_->seekg(eocd_.centralDirectoryOffset);
  is_->read((char*) &cdfh_, sizeof(cdfh_));
  ASSERT(is_->good());
  checkSignature(0x02014b50, cdfh_.signature);

  // Load local file header
  is_->seekg(cdfh_.relativeOffsetOflocalHeader);
  is_->read((char*) &lfh_, sizeof(lfh_));
  ASSERT(is_->good());
  checkSignature(0x04034b50, lfh_.signature);

  // Load filename
  fileName_ = loadString(is_, lfh_.fileNameLength);
  extraField_ = loadString(is_, lfh_.extraFieldLength);
}